

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3ConstructBloomFilter(WhereInfo *pWInfo,int iLevel,WhereLevel *pLevel,Bitmask notReady)

{
  byte *pbVar1;
  u8 uVar2;
  short sVar3;
  ushort uVar4;
  Parse *pParse;
  Vdbe *p;
  SrcList *pSVar5;
  Vdbe *p_00;
  WhereLoop *pWVar6;
  Index *pIVar7;
  Table *pTVar8;
  WhereLevel *pWVar9;
  byte bVar10;
  int iVar11;
  int iVar12;
  undefined4 extraout_var;
  long lVar13;
  Op *pOVar14;
  uint uVar15;
  WhereTerm *pWVar16;
  WhereTerm *pWVar17;
  WhereLoop *pWVar18;
  int iVar19;
  char *pcVar20;
  uint uVar21;
  ulong uVar22;
  bool bVar23;
  char zBuf [100];
  StrAccum local_e8;
  WhereInfo *local_c8;
  int local_bc;
  WhereLoop *local_b8;
  WhereLevel *local_b0;
  Bitmask local_a8;
  undefined8 local_a0;
  char local_98 [104];
  
  pParse = pWInfo->pParse;
  p = pParse->pVdbe;
  pWVar18 = pLevel->pWLoop;
  local_a8 = notReady;
  local_bc = sqlite3VdbeAddOp3(p,0xf,0,0,0);
  local_b0 = pWInfo->a;
  local_c8 = pWInfo;
  do {
    pSVar5 = pWInfo->pTabList;
    bVar10 = pLevel->iFrom;
    local_e8.db = pParse->db;
    p_00 = pParse->pVdbe;
    local_e8.zText = local_98;
    local_e8.nAlloc = 100;
    local_e8.mxAlloc = 1000000000;
    local_e8.nChar = 0;
    local_e8.accError = '\0';
    local_e8.printfFlags = '\x01';
    sqlite3_str_appendf(&local_e8,"BLOOM FILTER ON %S (",pSVar5->a + bVar10);
    pWVar6 = pLevel->pWLoop;
    if ((pWVar6->wsFlags & 0x100) == 0) {
      uVar22 = (ulong)pWVar6->nSkip;
      if (pWVar6->nSkip < (pWVar6->u).btree.nEq) {
        do {
          pIVar7 = (pWVar6->u).btree.pIndex;
          sVar3 = pIVar7->aiColumn[uVar22];
          pcVar20 = "<expr>";
          if (sVar3 != -2) {
            if (sVar3 == -1) {
              pcVar20 = "rowid";
            }
            else {
              pcVar20 = pIVar7->pTable->aCol[sVar3].zCnName;
            }
          }
          if (pWVar6->nSkip < uVar22) {
            if (local_e8.nChar + 5 < local_e8.nAlloc) {
              builtin_strncpy(local_e8.zText + local_e8.nChar," AND ",5);
              local_e8.nChar = local_e8.nChar + 5;
            }
            else {
              enlargeAndAppend(&local_e8," AND ",5);
            }
          }
          sqlite3_str_appendf(&local_e8,"%s=?",pcVar20);
          uVar22 = uVar22 + 1;
        } while (uVar22 < (pWVar6->u).btree.nEq);
      }
    }
    else {
      pTVar8 = pSVar5->a[bVar10].pTab;
      lVar13 = (long)pTVar8->iPKey;
      if (lVar13 < 0) {
        sqlite3_str_appendf(&local_e8,"rowid=?");
      }
      else {
        sqlite3_str_appendf(&local_e8,"%s=?",pTVar8->aCol[lVar13].zCnName);
      }
    }
    local_b8 = pWVar18;
    if (local_e8.nChar + 1 < local_e8.nAlloc) {
      local_e8.zText[local_e8.nChar] = ')';
      local_e8.nChar = local_e8.nChar + 1;
    }
    else {
      enlargeAndAppend(&local_e8,")",1);
    }
    pWInfo = local_c8;
    pcVar20 = sqlite3StrAccumFinish(&local_e8);
    iVar11 = sqlite3VdbeAddOp3(p_00,0xb9,p_00->nOp,pParse->addrExplain,0);
    sqlite3VdbeChangeP4(p_00,iVar11,pcVar20,-6);
    iVar12 = pParse->nLabel + -1;
    pParse->nLabel = iVar12;
    iVar11 = pLevel->iTabCur;
    iVar19 = pParse->nMem + 1;
    pParse->nMem = iVar19;
    pLevel->regFilter = iVar19;
    pSVar5 = pWInfo->pTabList;
    bVar10 = pLevel->iFrom;
    uVar22 = sqlite3LogEstToInt((pSVar5->a[bVar10].pTab)->nRowLogEst);
    if (9999999 < uVar22) {
      uVar22 = 10000000;
    }
    if (uVar22 < 0x2711) {
      uVar22 = 10000;
    }
    sqlite3VdbeAddOp3(p,0x4d,(int)uVar22,iVar19,0);
    iVar19 = sqlite3VdbeAddOp3(p,0x24,iVar11,0,0);
    local_a0 = CONCAT44(extraout_var,iVar19);
    lVar13 = (long)(pWInfo->sWC).nTerm;
    if (0 < lVar13) {
      pWVar16 = (pWInfo->sWC).a;
      pWVar17 = pWVar16 + lVar13;
      do {
        if (((pWVar16->wtFlags & 2) == 0) &&
           (iVar19 = sqlite3ExprIsTableConstraint(pWVar16->pExpr,pSVar5->a + bVar10), iVar19 != 0))
        {
          sqlite3ExprIfFalse(pParse,pWVar16->pExpr,iVar12,0x10);
        }
        pWVar16 = pWVar16 + 1;
      } while (pWVar16 < pWVar17);
    }
    pWVar18 = local_b8;
    if ((local_b8->wsFlags & 0x100) == 0) {
      pIVar7 = (local_b8->u).btree.pIndex;
      uVar4 = (local_b8->u).btree.nEq;
      uVar15 = (uint)uVar4;
      iVar19 = sqlite3GetTempRange(pParse,uVar15);
      if (uVar4 != 0) {
        uVar22 = 0;
        do {
          sqlite3ExprCodeGetColumnOfTable
                    (p,pIVar7->pTable,iVar11,(int)pIVar7->aiColumn[uVar22],iVar19 + (int)uVar22);
          uVar22 = uVar22 + 1;
        } while (uVar15 != uVar22);
      }
      iVar11 = sqlite3VdbeAddOp3(p,0xb4,pLevel->regFilter,0,iVar19);
      if (p->db->mallocFailed == '\0') {
        pOVar14 = p->aOp;
        pOVar14[iVar11].p4type = -3;
        pOVar14[iVar11].p4.i = uVar15;
      }
      pWInfo = local_c8;
      pWVar18 = local_b8;
      if (uVar15 == 1) goto LAB_0019e790;
      if (pParse->nRangeReg < (int)uVar15) {
        pParse->nRangeReg = uVar15;
        pParse->iRangeReg = iVar19;
      }
    }
    else {
      if (pParse->nTempReg == '\0') {
        iVar19 = pParse->nMem + 1;
        pParse->nMem = iVar19;
      }
      else {
        bVar10 = pParse->nTempReg - 1;
        pParse->nTempReg = bVar10;
        iVar19 = pParse->aTempReg[bVar10];
      }
      sqlite3VdbeAddOp3(p,0x87,iVar11,iVar19,0);
      iVar11 = sqlite3VdbeAddOp3(p,0xb4,pLevel->regFilter,0,iVar19);
      if (p->db->mallocFailed == '\0') {
        pOVar14 = p->aOp;
        pOVar14[iVar11].p4type = -3;
        pOVar14[iVar11].p4.i = 1;
      }
LAB_0019e790:
      if (iVar19 != 0) {
        bVar10 = pParse->nTempReg;
        if ((ulong)bVar10 < 8) {
          pParse->nTempReg = bVar10 + 1;
          pParse->aTempReg[bVar10] = iVar19;
        }
      }
    }
    sqlite3VdbeResolveLabel(p,iVar12);
    iVar12 = (int)local_a0;
    sqlite3VdbeAddOp3(p,0x27,pLevel->iTabCur,iVar12 + 1,0);
    iVar11 = p->nOp;
    uVar2 = p->db->mallocFailed;
    pOVar14 = (Op *)&sqlite3VdbeGetOp_dummy;
    if (uVar2 == '\0') {
      pOVar14 = p->aOp + iVar12;
    }
    pOVar14->p2 = iVar11;
    pbVar1 = (byte *)((long)&pWVar18->wsFlags + 2);
    *pbVar1 = *pbVar1 & 0xbf;
    uVar15 = pParse->db->dbOptFlags;
    if ((uVar15 >> 0x14 & 1) == 0) {
      uVar21 = iLevel + 1;
      iLevel = uVar21;
      if ((int)uVar21 < (int)(uint)pWInfo->nLevel) {
        iLevel = (int)pWInfo->nLevel;
        lVar13 = 0;
        pWVar9 = local_b0 + (int)uVar21;
        do {
          pLevel = pWVar9;
          if ((pWInfo->pTabList->a[pLevel->iFrom].fg.jointype & 0x48) == 0) {
            pWVar18 = pLevel->pWLoop;
            if (pWVar18 == (WhereLoop *)0x0) {
              pWVar18 = (WhereLoop *)0x0;
              goto LAB_0019e86b;
            }
            if ((pWVar18->prereq & local_a8) != 0) goto LAB_0019e86b;
            bVar23 = (pWVar18->wsFlags & 0x400004) == 0x400000;
          }
          else {
LAB_0019e86b:
            bVar23 = false;
          }
          if (bVar23) {
            iLevel = uVar21 - (int)lVar13;
            break;
          }
          lVar13 = lVar13 + -1;
          pWVar9 = pLevel + 1;
        } while ((long)(int)uVar21 - (ulong)(uint)iLevel != lVar13);
      }
    }
    if (((uVar15 >> 0x14 & 1) != 0) || ((int)(uint)pWInfo->nLevel <= iLevel)) {
      if (uVar2 == '\0') {
        pOVar14 = p->aOp + local_bc;
      }
      else {
        pOVar14 = (Op *)&sqlite3VdbeGetOp_dummy;
      }
      pOVar14->p2 = iVar11;
      return;
    }
  } while( true );
}

Assistant:

static SQLITE_NOINLINE void sqlite3ConstructBloomFilter(
  WhereInfo *pWInfo,    /* The WHERE clause */
  int iLevel,           /* Index in pWInfo->a[] that is pLevel */
  WhereLevel *pLevel,   /* Make a Bloom filter for this FROM term */
  Bitmask notReady      /* Loops that are not ready */
){
  int addrOnce;                        /* Address of opening OP_Once */
  int addrTop;                         /* Address of OP_Rewind */
  int addrCont;                        /* Jump here to skip a row */
  const WhereTerm *pTerm;              /* For looping over WHERE clause terms */
  const WhereTerm *pWCEnd;             /* Last WHERE clause term */
  Parse *pParse = pWInfo->pParse;      /* Parsing context */
  Vdbe *v = pParse->pVdbe;             /* VDBE under construction */
  WhereLoop *pLoop = pLevel->pWLoop;   /* The loop being coded */
  int iCur;                            /* Cursor for table getting the filter */

  assert( pLoop!=0 );
  assert( v!=0 );
  assert( pLoop->wsFlags & WHERE_BLOOMFILTER );

  addrOnce = sqlite3VdbeAddOp0(v, OP_Once); VdbeCoverage(v);
  do{
    const SrcItem *pItem;
    const Table *pTab;
    u64 sz;
    sqlite3WhereExplainBloomFilter(pParse, pWInfo, pLevel);
    addrCont = sqlite3VdbeMakeLabel(pParse);
    iCur = pLevel->iTabCur;
    pLevel->regFilter = ++pParse->nMem;

    /* The Bloom filter is a Blob held in a register.  Initialize it
    ** to zero-filled blob of at least 80K bits, but maybe more if the
    ** estimated size of the table is larger.  We could actually
    ** measure the size of the table at run-time using OP_Count with
    ** P3==1 and use that value to initialize the blob.  But that makes
    ** testing complicated.  By basing the blob size on the value in the
    ** sqlite_stat1 table, testing is much easier.
    */
    pItem = &pWInfo->pTabList->a[pLevel->iFrom];
    assert( pItem!=0 );
    pTab = pItem->pTab;
    assert( pTab!=0 );
    sz = sqlite3LogEstToInt(pTab->nRowLogEst);
    if( sz<10000 ){
      sz = 10000;
    }else if( sz>10000000 ){
      sz = 10000000;
    }
    sqlite3VdbeAddOp2(v, OP_Blob, (int)sz, pLevel->regFilter);

    addrTop = sqlite3VdbeAddOp1(v, OP_Rewind, iCur); VdbeCoverage(v);
    pWCEnd = &pWInfo->sWC.a[pWInfo->sWC.nTerm];
    for(pTerm=pWInfo->sWC.a; pTerm<pWCEnd; pTerm++){
      Expr *pExpr = pTerm->pExpr;
      if( (pTerm->wtFlags & TERM_VIRTUAL)==0
       && sqlite3ExprIsTableConstraint(pExpr, pItem)
      ){
        sqlite3ExprIfFalse(pParse, pTerm->pExpr, addrCont, SQLITE_JUMPIFNULL);
      }
    }
    if( pLoop->wsFlags & WHERE_IPK ){
      int r1 = sqlite3GetTempReg(pParse);
      sqlite3VdbeAddOp2(v, OP_Rowid, iCur, r1);
      sqlite3VdbeAddOp4Int(v, OP_FilterAdd, pLevel->regFilter, 0, r1, 1);
      sqlite3ReleaseTempReg(pParse, r1);
    }else{
      Index *pIdx = pLoop->u.btree.pIndex;
      int n = pLoop->u.btree.nEq;
      int r1 = sqlite3GetTempRange(pParse, n);
      int jj;
      for(jj=0; jj<n; jj++){
        int iCol = pIdx->aiColumn[jj];
        assert( pIdx->pTable==pItem->pTab );
        sqlite3ExprCodeGetColumnOfTable(v, pIdx->pTable, iCur, iCol,r1+jj);
      }
      sqlite3VdbeAddOp4Int(v, OP_FilterAdd, pLevel->regFilter, 0, r1, n);
      sqlite3ReleaseTempRange(pParse, r1, n);
    }
    sqlite3VdbeResolveLabel(v, addrCont);
    sqlite3VdbeAddOp2(v, OP_Next, pLevel->iTabCur, addrTop+1);
    VdbeCoverage(v);
    sqlite3VdbeJumpHere(v, addrTop);
    pLoop->wsFlags &= ~WHERE_BLOOMFILTER;
    if( OptimizationDisabled(pParse->db, SQLITE_BloomPulldown) ) break;
    while( ++iLevel < pWInfo->nLevel ){
      const SrcItem *pTabItem;
      pLevel = &pWInfo->a[iLevel];
      pTabItem = &pWInfo->pTabList->a[pLevel->iFrom];
      if( pTabItem->fg.jointype & (JT_LEFT|JT_LTORJ) ) continue;
      pLoop = pLevel->pWLoop;
      if( NEVER(pLoop==0) ) continue;
      if( pLoop->prereq & notReady ) continue;
      if( (pLoop->wsFlags & (WHERE_BLOOMFILTER|WHERE_COLUMN_IN))
                 ==WHERE_BLOOMFILTER
      ){
        /* This is a candidate for bloom-filter pull-down (early evaluation).
        ** The test that WHERE_COLUMN_IN is omitted is important, as we are
        ** not able to do early evaluation of bloom filters that make use of
        ** the IN operator */
        break;
      }
    }
  }while( iLevel < pWInfo->nLevel );
  sqlite3VdbeJumpHere(v, addrOnce);
}